

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

string * google::protobuf::compiler::cpp::SafeFunctionName
                   (string *__return_storage_ptr__,Descriptor *descriptor,FieldDescriptor *field,
                   string *prefix)

{
  long lVar1;
  FieldDescriptor *pFVar2;
  const_iterator cVar3;
  size_type sVar4;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  lVar1 = **(long **)(field + 8);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,lVar1,(*(long **)(field + 8))[1] + lVar1);
  if (local_48._M_string_length != 0) {
    sVar4 = 0;
    do {
      if ((byte)(local_48._M_dataplus._M_p[sVar4] + 0xbfU) < 0x1a) {
        local_48._M_dataplus._M_p[sVar4] = local_48._M_dataplus._M_p[sVar4] | 0x20;
      }
      sVar4 = sVar4 + 1;
    } while (local_48._M_string_length != sVar4);
  }
  std::operator+(__return_storage_ptr__,prefix,&local_48);
  pFVar2 = Descriptor::FindFieldByName(descriptor,__return_storage_ptr__);
  if ((pFVar2 != (FieldDescriptor *)0x0) ||
     (cVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find((anonymous_namespace)::kKeywords_abi_cxx11_,&local_48),
     cVar3.
     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
     ._M_cur != (__node_type *)0x0)) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SafeFunctionName(const Descriptor* descriptor,
                             const FieldDescriptor* field,
                             const std::string& prefix) {
  // Do not use FieldName() since it will escape keywords.
  std::string name = field->name();
  LowerString(&name);
  std::string function_name = prefix + name;
  if (descriptor->FindFieldByName(function_name)) {
    // Single underscore will also make it conflicting with the private data
    // member. We use double underscore to escape function names.
    function_name.append("__");
  } else if (kKeywords.count(name) > 0) {
    // If the field name is a keyword, we append the underscore back to keep it
    // consistent with other function names.
    function_name.append("_");
  }
  return function_name;
}